

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O2

int Gia_ManFaultAnalyze(sat_solver *pSat,Vec_Int_t *vPars,Vec_Int_t *vMap,Vec_Int_t *vLits,int Iter)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  abctime aVar6;
  abctime time;
  ulong uVar7;
  int iVar8;
  int Lit;
  uint local_4c;
  uint local_48;
  int local_44;
  abctime local_40;
  Vec_Int_t *local_38;
  
  local_48 = Iter;
  local_40 = Abc_Clock();
  if (vPars->nSize != vMap->nSize) {
    __assert_fail("Vec_IntSize(vPars) == Vec_IntSize(vMap)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x4ec,
                  "int Gia_ManFaultAnalyze(sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  vLits->nSize = 0;
  Vec_IntAppend(vLits,vMap);
  iVar8 = 0;
  iVar3 = 0;
  local_4c = 0;
  local_38 = vMap;
  do {
    if (vPars->nSize <= iVar8) {
      uVar1 = vMap->nSize;
      uVar5 = 0;
      uVar7 = 0;
      if (0 < (int)uVar1) {
        uVar7 = (ulong)uVar1;
      }
      iVar8 = 0;
      for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
        iVar8 = iVar8 + (uint)(0 < vMap->pArray[uVar5]);
      }
      printf("Iteration %3d has determined %5d (out of %5d) parameters after %6d SAT calls.  ",
             (ulong)local_48,(ulong)(uVar1 - iVar8),(ulong)(uint)vPars->nSize,(ulong)local_4c);
      aVar6 = Abc_Clock();
      Abc_PrintTime(0x816bba,(char *)(aVar6 - local_40),time);
      return iVar3;
    }
    iVar2 = Vec_IntEntry(vLits,iVar8);
    if (iVar2 != 0) {
      iVar2 = Vec_IntEntry(vLits,iVar8);
      if (iVar2 != 1) {
        __assert_fail("Vec_IntEntry(vLits, v) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                      ,0x4f4,
                      "int Gia_ManFaultAnalyze(sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      local_4c = local_4c + 1;
      iVar2 = Vec_IntEntry(vPars,iVar8);
      Lit = Abc_Var2Lit(iVar2,0);
      iVar2 = sat_solver_solve(pSat,&Lit,(lit *)&local_4c,100,0,0,0);
      if (iVar2 == -1) {
        iVar2 = Vec_IntEntry(vMap,iVar8);
        if (iVar2 != 1) {
          __assert_fail("Vec_IntEntry(vMap, v) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                        ,0x4fd,
                        "int Gia_ManFaultAnalyze(sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                       );
        }
        iVar3 = iVar3 + 1;
        Vec_IntWriteEntry(vMap,iVar8,0);
        Lit = Abc_LitNot(Lit);
      }
      else if (iVar2 != 0) {
        local_44 = iVar3;
        for (iVar2 = 0; iVar2 < vPars->nSize; iVar2 = iVar2 + 1) {
          iVar3 = Vec_IntEntry(vPars,iVar2);
          iVar4 = Vec_IntEntry(vLits,iVar2);
          if (iVar4 != 0) {
            iVar3 = sat_solver_var_value(pSat,iVar3);
            if (iVar3 != 0) {
              Vec_IntWriteEntry(vLits,iVar2,0);
            }
          }
        }
        iVar2 = Vec_IntEntry(vLits,iVar8);
        vMap = local_38;
        iVar3 = local_44;
        if (iVar2 != 0) {
          __assert_fail("Vec_IntEntry(vLits, v) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                        ,0x507,
                        "int Gia_ManFaultAnalyze(sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                       );
        }
      }
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

int Gia_ManFaultAnalyze( sat_solver * pSat, Vec_Int_t * vPars, Vec_Int_t * vMap, Vec_Int_t * vLits, int Iter )
{
    int nConfLimit = 100;
    int status, i, v, iVar, Lit;
    int nUnsats = 0, nRuns = 0;
    abctime clk = Abc_Clock();
    assert( Vec_IntSize(vPars) == Vec_IntSize(vMap) );
    // check presence of each variable
    Vec_IntClear( vLits );
    Vec_IntAppend( vLits, vMap );
    for ( v = 0; v < Vec_IntSize(vPars); v++ )
    {
        if ( !Vec_IntEntry(vLits, v) )
            continue;
        assert( Vec_IntEntry(vLits, v) == 1 );
        nRuns++;
        Lit = Abc_Var2Lit( Vec_IntEntry(vPars, v), 0 );
        status = sat_solver_solve( pSat, &Lit, &Lit+1, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( status == l_Undef )
            continue;
        if ( status == l_False )
        {
            nUnsats++;
            assert( Vec_IntEntry(vMap, v) == 1 );
            Vec_IntWriteEntry( vMap, v, 0 );
            Lit = Abc_LitNot(Lit);
            //status = sat_solver_addclause( pSat, &Lit, &Lit+1 );
            //assert( status );
            continue;
        }
        Vec_IntForEachEntry( vPars, iVar, i )
            if ( Vec_IntEntry(vLits, i) && sat_solver_var_value(pSat, iVar) )
                Vec_IntWriteEntry( vLits, i, 0 );
        assert( Vec_IntEntry(vLits, v) == 0 );
    }
    printf( "Iteration %3d has determined %5d (out of %5d) parameters after %6d SAT calls.  ", Iter, Vec_IntSize(vMap) - Vec_IntCountPositive(vMap), Vec_IntSize(vPars), nRuns );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return nUnsats;
}